

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O1

int __thiscall
ON_UuidPairList::GetId1s(ON_UuidPairList *this,ON_SimpleArray<ON_UUID_struct> *uuid_list)

{
  int iVar1;
  bool bVar2;
  ulong new_capacity;
  long lVar3;
  long lVar4;
  
  iVar1 = uuid_list->m_count;
  new_capacity = (ulong)(((this->super_ON_SimpleArray<ON_UuidPair>).m_count + iVar1) -
                        this->m_removed_count);
  if ((ulong)(long)uuid_list->m_capacity < new_capacity) {
    ON_SimpleArray<ON_UUID_struct>::SetCapacity(uuid_list,new_capacity);
  }
  if (0 < (this->super_ON_SimpleArray<ON_UuidPair>).m_count) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      bVar2 = ::operator==(&ON_max_uuid,
                           (ON_UUID_struct *)
                           (((this->super_ON_SimpleArray<ON_UuidPair>).m_a)->m_uuid[0].Data4 +
                           lVar3 + -8));
      if (bVar2) {
        bVar2 = ::operator==(&ON_max_uuid,
                             (ON_UUID_struct *)
                             (((this->super_ON_SimpleArray<ON_UuidPair>).m_a)->m_uuid[1].Data4 +
                             lVar3 + -8));
        if (!bVar2) goto LAB_003c02cc;
      }
      else {
LAB_003c02cc:
        ON_SimpleArray<ON_UUID_struct>::Append
                  (uuid_list,
                   (ON_UUID_struct *)
                   (((this->super_ON_SimpleArray<ON_UuidPair>).m_a)->m_uuid[0].Data4 + lVar3 + -8));
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar4 < (this->super_ON_SimpleArray<ON_UuidPair>).m_count);
  }
  return uuid_list->m_count - iVar1;
}

Assistant:

int ON_UuidPairList::GetId1s(
    ON_SimpleArray<ON_UUID>& uuid_list
    ) const
{
  const int count0 = uuid_list.Count();
  int i;
  uuid_list.Reserve(uuid_list.Count() + m_count - m_removed_count);
  for ( i = 0; i < m_count; i++ )
  {
    if ( ON_max_uuid == m_a[i].m_uuid[0] && ON_max_uuid == m_a[i].m_uuid[1] )
      continue;
    uuid_list.Append(m_a[i].m_uuid[0]);
  }
  return uuid_list.Count() - count0;
}